

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_setpoint.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_setpoint::Reset(ChFunctionRotation_setpoint *this,double s)

{
  this->S = s;
  ChQuaternion<double>::operator=(&this->Q,(ChQuaternion<double> *)&QUNIT);
  (this->W).m_data[0] = 0.0;
  (this->W).m_data[1] = 0.0;
  (this->W).m_data[2] = 0.0;
  (this->A).m_data[0] = 0.0;
  (this->A).m_data[0] = 0.0;
  (this->A).m_data[1] = 0.0;
  (this->A).m_data[2] = 0.0;
  this->last_S = 0.0;
  ChQuaternion<double>::operator=(&this->last_Q,(ChQuaternion<double> *)&QUNIT);
  (this->last_W).m_data[2] = 0.0;
  (this->last_W).m_data[0] = 0.0;
  (this->last_W).m_data[1] = 0.0;
  return;
}

Assistant:

void ChFunctionRotation_setpoint::Reset(double s) {
    S = s;
    Q = QUNIT;
    W = 0;
    A = 0;
    last_S = 0;
    last_Q = QUNIT;
    last_W = 0;
}